

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O2

void __thiscall pstore::brokerface::fifo_path::~fifo_path(fifo_path *this)

{
  bool bVar1;
  bool expected;
  
  expected = true;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    (&this->needs_delete_,&expected,false,memory_order_seq_cst);
  if (bVar1) {
    unlink((this->path_)._M_dataplus._M_p);
  }
  std::_Function_base::~_Function_base(&(this->update_cb_).super__Function_base);
  std::__cxx11::string::~string((string *)&this->path_);
  return;
}

Assistant:

fifo_path::~fifo_path () {
            bool expected = true;
            if (needs_delete_.compare_exchange_strong (expected, false)) {
                ::unlink (path_.c_str ());
            }
        }